

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_text_wrap_colored(nk_context *ctx,char *str,int len,nk_color color)

{
  undefined4 in_ECX;
  nk_user_font *in_RDI;
  nk_text text;
  nk_rect bounds;
  nk_vec2 item_padding;
  nk_style *style;
  nk_window *win;
  nk_context *in_stack_ffffffffffffffb8;
  nk_rect *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  
  if (((in_RDI != (nk_user_font *)0x0) && (in_RDI[0x19f].userdata.ptr != (void *)0x0)) &&
     (*(long *)((long)in_RDI[0x19f].userdata.ptr + 0xa8) != 0)) {
    nk_panel_alloc_space(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    nk_widget_text_wrap((nk_command_buffer *)bounds._0_8_,stack0x00000018,(char *)text._8_8_,
                        (int)text.padding.y,(nk_text *)CONCAT44(in_ECX,in_stack_fffffffffffffff8),
                        in_RDI);
  }
  return;
}

Assistant:

NK_API void
nk_text_wrap_colored(struct nk_context *ctx, const char *str,
int len, struct nk_color color)
{
struct nk_window *win;
const struct nk_style *style;

struct nk_vec2 item_padding;
struct nk_rect bounds;
struct nk_text text;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout) return;

win = ctx->current;
style = &ctx->style;
nk_panel_alloc_space(&bounds, ctx);
item_padding = style->text.padding;

text.padding.x = item_padding.x;
text.padding.y = item_padding.y;
text.background = style->window.background;
text.text = color;
nk_widget_text_wrap(&win->buffer, bounds, str, len, &text, style->font);
}